

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O1

QTextStream * __thiscall QTextStream::operator<<(QTextStream *this,int i)

{
  _Head_base<0UL,_QTextStreamPrivate_*,_false> this_00;
  ulong number;
  
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
       super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  if (((this_00._M_head_impl)->string != (QString *)0x0) ||
     ((this_00._M_head_impl)->device != (QIODevice *)0x0)) {
    number = (ulong)(uint)-i;
    if (0 < i) {
      number = (ulong)(uint)i;
    }
    QTextStreamPrivate::putNumber(this_00._M_head_impl,number,SUB41((uint)i >> 0x1f,0));
  }
  return this;
}

Assistant:

QTextStream &QTextStream::operator<<(signed int i)
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(*this);
    d->putNumber(QtPrivate::qUnsignedAbs(i), i < 0);
    return *this;
}